

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O1

lua_Integer lua_tointegerx(lua_State *L,int idx,int *isnum)

{
  TValue *obj;
  lua_Integer lVar1;
  int iVar2;
  TValue n;
  TValue TStack_18;
  
  obj = index2addr(L,idx);
  if (obj->tt_ != 3) {
    obj = luaV_tonumber(obj,&TStack_18);
    if (obj == (TValue *)0x0) {
      iVar2 = 0;
      lVar1 = 0;
      goto LAB_001058c4;
    }
  }
  lVar1 = (lua_Integer)(obj->value_).n;
  iVar2 = 1;
LAB_001058c4:
  if (isnum != (int *)0x0) {
    *isnum = iVar2;
  }
  return lVar1;
}

Assistant:

LUA_API lua_Integer lua_tointegerx (lua_State *L, int idx, int *isnum) {
  TValue n;
  const TValue *o = index2addr(L, idx);
  if (tonumber(o, &n)) {
    lua_Integer res;
    lua_Number num = nvalue(o);
    lua_number2integer(res, num);
    if (isnum) *isnum = 1;
    return res;
  }
  else {
    if (isnum) *isnum = 0;
    return 0;
  }
}